

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

void usage(char *cmd)

{
  printf("Usage: %s [options] host port\n\nOptions:\n  -4                   force IPv4\n  -6                   force IPv6\n  -a                   require client authentication\n  -b                   enable brotli compression\n  -C certificate-file  certificate chain used for client authentication\n  -c certificate-file  certificate chain used for server authentication\n  -i file              a file to read from and send to the peer (default: stdin)\n  -k key-file          specifies the credentials for signing the certificate\n  -l log-file          file to log events (incl. traffic secrets)\n  -n                   negotiates the key exchange method (i.e. wait for HRR)\n  -N named-group       named group to be used (default: secp256r1)\n  -s session-file      file to read/write the session ticket\n  -S                   require public key exchange when resuming a session\n  -E esni-file         file that stores ESNI data generated by picotls-esni\n  -e                   when resuming a session, send first 8,192 bytes of input\n                       as early data\n  -u                   update the traffic key when handshake is complete\n  -v                   verify peer using the default certificates\n  -h                   print this help\n\nSupported named groups: secp256r1, secp384r1, secp521r1, X25519\n\n"
         ,cmd);
  return;
}

Assistant:

static void usage(const char *cmd)
{
    printf("Usage: %s [options] host port\n"
           "\n"
           "Options:\n"
           "  -4                   force IPv4\n"
           "  -6                   force IPv6\n"
           "  -a                   require client authentication\n"
           "  -b                   enable brotli compression\n"
           "  -C certificate-file  certificate chain used for client authentication\n"
           "  -c certificate-file  certificate chain used for server authentication\n"
           "  -i file              a file to read from and send to the peer (default: stdin)\n"
           "  -k key-file          specifies the credentials for signing the certificate\n"
           "  -l log-file          file to log events (incl. traffic secrets)\n"
           "  -n                   negotiates the key exchange method (i.e. wait for HRR)\n"
           "  -N named-group       named group to be used (default: secp256r1)\n"
           "  -s session-file      file to read/write the session ticket\n"
           "  -S                   require public key exchange when resuming a session\n"
           "  -E esni-file         file that stores ESNI data generated by picotls-esni\n"
           "  -e                   when resuming a session, send first 8,192 bytes of input\n"
           "                       as early data\n"
           "  -u                   update the traffic key when handshake is complete\n"
           "  -v                   verify peer using the default certificates\n"
           "  -h                   print this help\n"
           "\n"
           "Supported named groups: secp256r1"
#if PTLS_OPENSSL_HAVE_SECP384R1
           ", secp384r1"
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
           ", secp521r1"
#endif
#if PTLS_OPENSSL_HAVE_X25519
           ", X25519"
#endif
           "\n\n",
           cmd);
}